

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SweepGradientShadingPatternWritingTask.cpp
# Opt level: O3

void __thiscall
SweepGradientShadingPatternWritingTask::SweepGradientShadingPatternWritingTask
          (SweepGradientShadingPatternWritingTask *this,double inCX,double inCY,
          double inStartAngleRad,double inEndAngleRad,InterpretedGradientStopList *inColorLine,
          FT_PaintExtend inGradientExtend,PDFRectangle *inBounds,PDFMatrix *inMatrix,
          ObjectIDType inPatternObjectId)

{
  InterpretedGradientStopList *pIVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  (this->super_IObjectEndWritingTask)._vptr_IObjectEndWritingTask =
       (_func_int **)&PTR__SweepGradientShadingPatternWritingTask_003a89d0;
  pIVar1 = &this->mColorLine;
  (this->mColorLine).
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)pIVar1;
  (this->mColorLine).
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)pIVar1;
  (this->mColorLine).
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node._M_size = 0;
  PDFRectangle::PDFRectangle(&this->mBounds);
  PDFMatrix::PDFMatrix(&this->mMatrix);
  this->cX = inCX;
  this->cY = inCY;
  this->startAngleRad = inStartAngleRad;
  this->endAngleRad = inEndAngleRad;
  if (pIVar1 != inColorLine) {
    std::__cxx11::list<InterpretedGradientStop,std::allocator<InterpretedGradientStop>>::
    _M_assign_dispatch<std::_List_const_iterator<InterpretedGradientStop>>
              ((list<InterpretedGradientStop,std::allocator<InterpretedGradientStop>> *)pIVar1,
               (inColorLine->
               super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>).
               _M_impl._M_node.super__List_node_base._M_next,inColorLine);
  }
  this->mGradientExtend = inGradientExtend;
  dVar2 = inBounds->LowerLeftX;
  dVar3 = inBounds->LowerLeftY;
  dVar4 = inBounds->UpperRightY;
  (this->mBounds).UpperRightX = inBounds->UpperRightX;
  (this->mBounds).UpperRightY = dVar4;
  (this->mBounds).LowerLeftX = dVar2;
  (this->mBounds).LowerLeftY = dVar3;
  dVar2 = inMatrix->a;
  dVar3 = inMatrix->b;
  dVar4 = inMatrix->c;
  dVar5 = inMatrix->d;
  dVar6 = inMatrix->f;
  (this->mMatrix).e = inMatrix->e;
  (this->mMatrix).f = dVar6;
  (this->mMatrix).c = dVar4;
  (this->mMatrix).d = dVar5;
  (this->mMatrix).a = dVar2;
  (this->mMatrix).b = dVar3;
  this->mPatternObjectId = inPatternObjectId;
  return;
}

Assistant:

SweepGradientShadingPatternWritingTask::SweepGradientShadingPatternWritingTask(
    double inCX,
    double inCY,
    double inStartAngleRad,
    double inEndAngleRad,
    InterpretedGradientStopList inColorLine,
    FT_PaintExtend inGradientExtend,
    PDFRectangle inBounds,
    PDFMatrix inMatrix,
    ObjectIDType inPatternObjectId
) {
    cX = inCX;
    cY = inCY;
    startAngleRad = inStartAngleRad;
    endAngleRad = inEndAngleRad;
    mColorLine = inColorLine;
    mGradientExtend = inGradientExtend;
    mBounds = inBounds;
    mMatrix = inMatrix;
    mPatternObjectId = inPatternObjectId;
}